

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundCastExpression::Deserialize(BoundCastExpression *this,Deserializer *deserializer)

{
  __uniq_ptr_impl<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>_>
  _Var1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  tuple<duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_> this_00;
  ClientContext *context;
  pointer pBVar5;
  Expression *pEVar6;
  unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
  result;
  LogicalType return_type;
  __uniq_ptr_impl<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>_>
  local_70;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_68;
  Expression *local_60 [3];
  LogicalType local_48;
  
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"child");
  pEVar6 = (Expression *)0x0;
  if ((char)iVar3 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 == '\0') {
      pEVar6 = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)local_60,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pEVar6 = local_60[0];
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize((LogicalType *)local_60,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00.
  super__Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
  .super__Head_base<0UL,_duckdb::BoundCastExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
        )operator_new(0x80);
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  local_68._M_head_impl = pEVar6;
  LogicalType::LogicalType(&local_48,(LogicalType *)local_60);
  BoundCastExpression((BoundCastExpression *)
                      this_00.
                      super__Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
                      .super__Head_base<0UL,_duckdb::BoundCastExpression_*,_false>._M_head_impl,
                      context,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_68,&local_48);
  local_70._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
  .super__Head_base<0UL,_duckdb::BoundCastExpression_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>)
       (tuple<duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
       .super__Head_base<0UL,_duckdb::BoundCastExpression_*,_false>._M_head_impl;
  LogicalType::~LogicalType(&local_48);
  if (local_68._M_head_impl != (Expression *)0x0) {
    (*((local_68._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_68._M_head_impl = (Expression *)0x0;
  pBVar5 = unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
                         *)&local_70);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"try_cast");
  if ((char)uVar4 == '\0') {
    uVar2 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar3;
  }
  pBVar5->try_cast = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  _Var1._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
  .super__Head_base<0UL,_duckdb::BoundCastExpression_*,_false>._M_head_impl =
       local_70._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
       .super__Head_base<0UL,_duckdb::BoundCastExpression_*,_false>._M_head_impl;
  local_70._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
  .super__Head_base<0UL,_duckdb::BoundCastExpression_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>)
       (_Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
        )0x0;
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
       .super__Head_base<0UL,_duckdb::BoundCastExpression_*,_false>._M_head_impl;
  LogicalType::~LogicalType((LogicalType *)local_60);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundCastExpression::Deserialize(Deserializer &deserializer) {
	auto child = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(200, "child");
	auto return_type = deserializer.ReadProperty<LogicalType>(201, "return_type");
	auto result = duckdb::unique_ptr<BoundCastExpression>(new BoundCastExpression(deserializer.Get<ClientContext &>(), std::move(child), std::move(return_type)));
	deserializer.ReadPropertyWithDefault<bool>(202, "try_cast", result->try_cast);
	return std::move(result);
}